

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.cpp
# Opt level: O1

void duckdb_brotli::BrotliBuildMetaBlock
               (MemoryManager *m,uint8_t *ringbuffer,size_t pos,size_t mask,
               BrotliEncoderParams *params,uint8_t prev_byte,uint8_t prev_byte2,Command *cmds,
               size_t num_commands,ContextType literal_context_mode,MetaBlockSplit *mb)

{
  BrotliDistanceParams *pBVar1;
  BlockSplit *dist_split;
  undefined1 auVar2 [16];
  uint32_t uVar3;
  int iVar4;
  HistogramDistance *pHVar5;
  ContextType *context_modes;
  HistogramCommand *__s;
  size_t sVar6;
  uint32_t *puVar7;
  HistogramLiteral *pHVar8;
  HistogramDistance *pHVar9;
  byte bVar10;
  long lVar11;
  ulong uVar12;
  uint32_t *puVar13;
  uint uVar14;
  uint32_t uVar15;
  ulong uVar16;
  long lVar17;
  size_t sVar18;
  uint16_t *puVar19;
  uint32_t ndirect;
  size_t sVar20;
  uint32_t npostfix;
  bool bVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int iVar27;
  HistogramLiteral *local_e8;
  double local_a0;
  double dist_cost;
  BrotliDistanceParams orig_params;
  BrotliDistanceParams new_params;
  
  pBVar1 = &params->dist;
  orig_params.max_distance = (params->dist).max_distance;
  orig_params.distance_postfix_bits = (params->dist).distance_postfix_bits;
  orig_params.num_direct_distance_codes = (params->dist).num_direct_distance_codes;
  orig_params.alphabet_size_max = (params->dist).alphabet_size_max;
  orig_params.alphabet_size_limit = (params->dist).alphabet_size_limit;
  new_params.max_distance = (params->dist).max_distance;
  new_params.distance_postfix_bits = (params->dist).distance_postfix_bits;
  new_params.num_direct_distance_codes = (params->dist).num_direct_distance_codes;
  new_params.alphabet_size_max = (params->dist).alphabet_size_max;
  new_params.alphabet_size_limit = (params->dist).alphabet_size_limit;
  pHVar5 = (HistogramDistance *)BrotliAllocate(m,0x890);
  uVar15 = orig_params.distance_postfix_bits;
  uVar3 = orig_params.num_direct_distance_codes;
  uVar14 = 0;
  bVar22 = true;
  local_a0 = 1e+99;
  npostfix = 0;
  do {
    if (uVar14 < 0x10) {
      do {
        ndirect = uVar14 << ((byte)npostfix & 0x1f);
        BrotliInitDistanceParams(&new_params,npostfix,ndirect,params->large_window);
        bVar21 = false;
        if (ndirect == uVar3 && npostfix == uVar15) {
          bVar22 = bVar21;
        }
        iVar4 = ComputeDistanceCost(cmds,num_commands,&orig_params,&new_params,&dist_cost,pHVar5);
        if (iVar4 != 0) {
          if (dist_cost <= local_a0) {
            (params->dist).max_distance = new_params.max_distance;
            pBVar1->distance_postfix_bits = new_params.distance_postfix_bits;
            pBVar1->num_direct_distance_codes = new_params.num_direct_distance_codes;
            (params->dist).alphabet_size_max = new_params.alphabet_size_max;
            (params->dist).alphabet_size_limit = new_params.alphabet_size_limit;
            bVar21 = true;
            local_a0 = dist_cost;
          }
          else {
            bVar21 = false;
          }
        }
        if (!bVar21) goto LAB_01c2d293;
        uVar14 = uVar14 + 1;
      } while (uVar14 != 0x10);
      uVar14 = 0x10;
    }
LAB_01c2d293:
    bVar21 = uVar14 == 0;
    uVar14 = uVar14 - 1 >> 1;
    if (bVar21) {
      uVar14 = 0;
    }
    npostfix = npostfix + 1;
  } while (npostfix != 4);
  if ((bVar22) &&
     (ComputeDistanceCost(cmds,num_commands,&orig_params,&orig_params,&dist_cost,pHVar5),
     dist_cost < local_a0)) {
    (params->dist).max_distance = orig_params.max_distance;
    pBVar1->distance_postfix_bits = orig_params.distance_postfix_bits;
    pBVar1->num_direct_distance_codes = orig_params.num_direct_distance_codes;
    (params->dist).alphabet_size_max = orig_params.alphabet_size_max;
    (params->dist).alphabet_size_limit = orig_params.alphabet_size_limit;
  }
  BrotliFree(m,pHVar5);
  if (orig_params.distance_postfix_bits == pBVar1->distance_postfix_bits) {
    if ((num_commands == 0) ||
       (orig_params.num_direct_distance_codes == (params->dist).num_direct_distance_codes))
    goto LAB_01c2d485;
  }
  else if (num_commands == 0) goto LAB_01c2d485;
  lVar17 = num_commands + (num_commands == 0);
  puVar19 = &cmds->dist_prefix_;
  do {
    if (((*(uint *)(puVar19 + -5) & 0x1ffffff) != 0) && (0x7f < puVar19[-1])) {
      uVar14 = *puVar19 & 0x3ff;
      if (orig_params.num_direct_distance_codes + 0x10 <= uVar14) {
        uVar14 = (uVar14 - orig_params.num_direct_distance_codes) - 0x10;
        uVar14 = (uVar14 & ~(-1 << ((byte)orig_params.distance_postfix_bits & 0x1f))) +
                 orig_params.num_direct_distance_codes + 0x10 +
                 ((((uVar14 >> (orig_params.distance_postfix_bits & 0x1f) & 1) != 0) + 2 <<
                  ((byte)(*puVar19 >> 10) & 0x1f)) + *(uint32_t *)(puVar19 + -3) + -4 <<
                 ((byte)orig_params.distance_postfix_bits & 0x1f));
      }
      uVar16 = (ulong)(params->dist).num_direct_distance_codes;
      uVar12 = uVar16 + 0x10;
      if (uVar14 < uVar12) {
        *puVar19 = (ushort)uVar14;
        uVar15 = 0;
      }
      else {
        bVar10 = (byte)pBVar1->distance_postfix_bits;
        uVar16 = ((uVar14 - uVar16) + (4L << (bVar10 & 0x3f))) - 0x10;
        uVar14 = 0x1f;
        if ((uint)uVar16 != 0) {
          for (; (uint)uVar16 >> uVar14 == 0; uVar14 = uVar14 - 1) {
          }
        }
        uVar14 = (uVar14 ^ 0xffffffe0) + 0x1f;
        bVar22 = (uVar16 >> ((ulong)uVar14 & 0x3f) & 1) != 0;
        iVar4 = uVar14 - pBVar1->distance_postfix_bits;
        *puVar19 = (short)((uint)bVar22 + iVar4 * 2 + 0xfffe << (bVar10 & 0x3f)) +
                   (short)uVar12 + (~(ushort)(-1 << (bVar10 & 0x1f)) & (ushort)uVar16) |
                   (short)iVar4 * 0x400;
        uVar15 = (uint32_t)
                 (uVar16 - ((ulong)bVar22 + 2 << ((byte)uVar14 & 0x3f)) >> (bVar10 & 0x3f));
      }
      *(uint32_t *)(puVar19 + -3) = uVar15;
    }
    puVar19 = puVar19 + 8;
    lVar17 = lVar17 + -1;
  } while (lVar17 != 0);
LAB_01c2d485:
  dist_split = &mb->distance_split;
  BrotliSplitBlock(m,cmds,num_commands,ringbuffer,pos,mask,params,&mb->literal_split,
                   &mb->command_split,dist_split);
  if (params->disable_literal_context_modeling == 0) {
    sVar18 = (mb->literal_split).num_types;
    if (sVar18 == 0) {
      context_modes = (ContextType *)0x0;
    }
    else {
      context_modes = (ContextType *)BrotliAllocate(m,sVar18 << 2);
    }
    auVar2 = _DAT_01de8e80;
    sVar18 = (mb->literal_split).num_types;
    lVar17 = 0x40;
    if (sVar18 != 0) {
      lVar11 = sVar18 - 1;
      auVar23._8_4_ = (int)lVar11;
      auVar23._0_8_ = lVar11;
      auVar23._12_4_ = (int)((ulong)lVar11 >> 0x20);
      uVar12 = 0;
      auVar23 = auVar23 ^ _DAT_01de8e80;
      auVar24 = _DAT_01df1090;
      auVar25 = _DAT_01df1070;
      do {
        auVar26 = auVar25 ^ auVar2;
        iVar4 = auVar23._4_4_;
        if ((bool)(~(auVar26._4_4_ == iVar4 && auVar23._0_4_ < auVar26._0_4_ ||
                    iVar4 < auVar26._4_4_) & 1)) {
          context_modes[uVar12] = literal_context_mode;
        }
        if ((auVar26._12_4_ != auVar23._12_4_ || auVar26._8_4_ <= auVar23._8_4_) &&
            auVar26._12_4_ <= auVar23._12_4_) {
          context_modes[uVar12 + 1] = literal_context_mode;
        }
        auVar26 = auVar24 ^ auVar2;
        iVar27 = auVar26._4_4_;
        if (iVar27 <= iVar4 && (iVar27 != iVar4 || auVar26._0_4_ <= auVar23._0_4_)) {
          context_modes[uVar12 + 2] = literal_context_mode;
          context_modes[uVar12 + 3] = literal_context_mode;
        }
        uVar12 = uVar12 + 4;
        lVar11 = auVar25._8_8_;
        auVar25._0_8_ = auVar25._0_8_ + 4;
        auVar25._8_8_ = lVar11 + 4;
        lVar11 = auVar24._8_8_;
        auVar24._0_8_ = auVar24._0_8_ + 4;
        auVar24._8_8_ = lVar11 + 4;
      } while ((sVar18 + 3 & 0xfffffffffffffffc) != uVar12);
    }
  }
  else {
    lVar17 = 1;
    context_modes = (ContextType *)0x0;
  }
  sVar18 = lVar17 * (mb->literal_split).num_types;
  if (sVar18 == 0) {
    local_e8 = (HistogramLiteral *)0x0;
  }
  else {
    local_e8 = (HistogramLiteral *)BrotliAllocate(m,sVar18 * 0x410);
    sVar20 = sVar18;
    pHVar8 = local_e8;
    do {
      switchD_0105b559::default(pHVar8,0,0x408);
      pHVar8->bit_cost_ = INFINITY;
      pHVar8 = pHVar8 + 1;
      sVar20 = sVar20 - 1;
    } while (sVar20 != 0);
  }
  lVar17 = dist_split->num_types * 4;
  if (lVar17 == 0) {
    pHVar5 = (HistogramDistance *)0x0;
  }
  else {
    pHVar5 = (HistogramDistance *)BrotliAllocate(m,dist_split->num_types * 0x2240);
    pHVar9 = pHVar5;
    do {
      switchD_0105b559::default(pHVar9,0,0x888);
      pHVar9->bit_cost_ = INFINITY;
      pHVar9 = pHVar9 + 1;
      lVar17 = lVar17 + -1;
    } while (lVar17 != 0);
  }
  sVar20 = (mb->command_split).num_types;
  mb->command_histograms_size = sVar20;
  if (sVar20 == 0) {
    __s = (HistogramCommand *)0x0;
  }
  else {
    __s = (HistogramCommand *)BrotliAllocate(m,sVar20 * 0xb10);
  }
  mb->command_histograms = __s;
  for (sVar20 = mb->command_histograms_size; sVar20 != 0; sVar20 = sVar20 - 1) {
    switchD_0105b559::default(__s,0,0xb08);
    __s->bit_cost_ = INFINITY;
    __s = __s + 1;
  }
  BrotliBuildHistogramsWithContext
            (cmds,num_commands,&mb->literal_split,&mb->command_split,dist_split,ringbuffer,pos,mask,
             prev_byte,prev_byte2,context_modes,local_e8,mb->command_histograms,pHVar5);
  BrotliFree(m,context_modes);
  sVar20 = (mb->literal_split).num_types;
  sVar6 = sVar20 << 6;
  mb->literal_context_map_size = sVar6;
  if (sVar6 == 0) {
    puVar7 = (uint32_t *)0x0;
  }
  else {
    puVar7 = (uint32_t *)BrotliAllocate(m,sVar20 << 8);
  }
  mb->literal_context_map = puVar7;
  sVar20 = mb->literal_context_map_size;
  mb->literal_histograms_size = sVar20;
  if (sVar20 == 0) {
    pHVar8 = (HistogramLiteral *)0x0;
  }
  else {
    pHVar8 = (HistogramLiteral *)BrotliAllocate(m,sVar20 * 0x410);
  }
  mb->literal_histograms = pHVar8;
  BrotliClusterHistogramsLiteral
            (m,local_e8,sVar18,0x100,pHVar8,&mb->literal_histograms_size,mb->literal_context_map);
  BrotliFree(m,local_e8);
  if ((params->disable_literal_context_modeling != 0) &&
     (sVar18 = (mb->literal_split).num_types, sVar18 != 0)) {
    puVar7 = mb->literal_context_map;
    puVar13 = puVar7 + sVar18 * 0x40;
    do {
      sVar18 = sVar18 - 1;
      lVar17 = -0x40;
      do {
        puVar13[lVar17] = puVar7[sVar18];
        lVar17 = lVar17 + 1;
      } while (lVar17 != 0);
      puVar13 = puVar13 + -0x40;
    } while (sVar18 != 0);
  }
  sVar20 = (mb->distance_split).num_types;
  sVar18 = sVar20 * 4;
  mb->distance_context_map_size = sVar18;
  if (sVar18 == 0) {
    puVar7 = (uint32_t *)0x0;
  }
  else {
    puVar7 = (uint32_t *)BrotliAllocate(m,sVar20 << 4);
  }
  mb->distance_context_map = puVar7;
  sVar18 = mb->distance_context_map_size;
  mb->distance_histograms_size = sVar18;
  if (sVar18 == 0) {
    pHVar9 = (HistogramDistance *)0x0;
  }
  else {
    pHVar9 = (HistogramDistance *)BrotliAllocate(m,sVar18 * 0x890);
  }
  mb->distance_histograms = pHVar9;
  BrotliClusterHistogramsDistance
            (m,pHVar5,mb->distance_context_map_size,0x100,pHVar9,&mb->distance_histograms_size,
             mb->distance_context_map);
  BrotliFree(m,pHVar5);
  return;
}

Assistant:

void duckdb_brotli::BrotliBuildMetaBlock(MemoryManager* m,
                          const uint8_t* ringbuffer,
                          const size_t pos,
                          const size_t mask,
                          BrotliEncoderParams* params,
                          uint8_t prev_byte,
                          uint8_t prev_byte2,
                          Command* cmds,
                          size_t num_commands,
                          ContextType literal_context_mode,
                          MetaBlockSplit* mb) {
  /* Histogram ids need to fit in one byte. */
  static const size_t kMaxNumberOfHistograms = 256;
  HistogramDistance* distance_histograms;
  HistogramLiteral* literal_histograms;
  ContextType* literal_context_modes = NULL;
  size_t literal_histograms_size;
  size_t distance_histograms_size;
  size_t i;
  size_t literal_context_multiplier = 1;
  uint32_t npostfix;
  uint32_t ndirect_msb = 0;
  BROTLI_BOOL check_orig = BROTLI_TRUE;
  double best_dist_cost = 1e99;
  BrotliDistanceParams orig_params = params->dist;
  BrotliDistanceParams new_params = params->dist;
  HistogramDistance* tmp = BROTLI_ALLOC(m, HistogramDistance, 1);

  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(tmp)) return;

  for (npostfix = 0; npostfix <= BROTLI_MAX_NPOSTFIX; npostfix++) {
    for (; ndirect_msb < 16; ndirect_msb++) {
      uint32_t ndirect = ndirect_msb << npostfix;
      BROTLI_BOOL skip;
      double dist_cost;
      BrotliInitDistanceParams(&new_params, npostfix, ndirect,
                               params->large_window);
      if (npostfix == orig_params.distance_postfix_bits &&
          ndirect == orig_params.num_direct_distance_codes) {
        check_orig = BROTLI_FALSE;
      }
      skip = !ComputeDistanceCost(
          cmds, num_commands, &orig_params, &new_params, &dist_cost, tmp);
      if (skip || (dist_cost > best_dist_cost)) {
        break;
      }
      best_dist_cost = dist_cost;
      params->dist = new_params;
    }
    if (ndirect_msb > 0) ndirect_msb--;
    ndirect_msb /= 2;
  }
  if (check_orig) {
    double dist_cost;
    ComputeDistanceCost(cmds, num_commands, &orig_params, &orig_params,
                        &dist_cost, tmp);
    if (dist_cost < best_dist_cost) {
      /* NB: currently unused; uncomment when more param tuning is added. */
      /* best_dist_cost = dist_cost; */
      params->dist = orig_params;
    }
  }
  BROTLI_FREE(m, tmp);
  RecomputeDistancePrefixes(cmds, num_commands, &orig_params, &params->dist);

  BrotliSplitBlock(m, cmds, num_commands,
                   ringbuffer, pos, mask, params,
                   &mb->literal_split,
                   &mb->command_split,
                   &mb->distance_split);
  if (BROTLI_IS_OOM(m)) return;

  if (!params->disable_literal_context_modeling) {
    literal_context_multiplier = 1 << BROTLI_LITERAL_CONTEXT_BITS;
    literal_context_modes =
        BROTLI_ALLOC(m, ContextType, mb->literal_split.num_types);
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(literal_context_modes)) return;
    for (i = 0; i < mb->literal_split.num_types; ++i) {
      literal_context_modes[i] = literal_context_mode;
    }
  }

  literal_histograms_size =
      mb->literal_split.num_types * literal_context_multiplier;
  literal_histograms =
      BROTLI_ALLOC(m, HistogramLiteral, literal_histograms_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(literal_histograms)) return;
  ClearHistogramsLiteral(literal_histograms, literal_histograms_size);

  distance_histograms_size =
      mb->distance_split.num_types << BROTLI_DISTANCE_CONTEXT_BITS;
  distance_histograms =
      BROTLI_ALLOC(m, HistogramDistance, distance_histograms_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(distance_histograms)) return;
  ClearHistogramsDistance(distance_histograms, distance_histograms_size);

  BROTLI_DCHECK(mb->command_histograms == 0);
  mb->command_histograms_size = mb->command_split.num_types;
  mb->command_histograms =
      BROTLI_ALLOC(m, HistogramCommand, mb->command_histograms_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(mb->command_histograms)) return;
  ClearHistogramsCommand(mb->command_histograms, mb->command_histograms_size);

  BrotliBuildHistogramsWithContext(cmds, num_commands,
      &mb->literal_split, &mb->command_split, &mb->distance_split,
      ringbuffer, pos, mask, prev_byte, prev_byte2, literal_context_modes,
      literal_histograms, mb->command_histograms, distance_histograms);
  BROTLI_FREE(m, literal_context_modes);

  BROTLI_DCHECK(mb->literal_context_map == 0);
  mb->literal_context_map_size =
      mb->literal_split.num_types << BROTLI_LITERAL_CONTEXT_BITS;
  mb->literal_context_map =
      BROTLI_ALLOC(m, uint32_t, mb->literal_context_map_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(mb->literal_context_map)) return;

  BROTLI_DCHECK(mb->literal_histograms == 0);
  mb->literal_histograms_size = mb->literal_context_map_size;
  mb->literal_histograms =
      BROTLI_ALLOC(m, HistogramLiteral, mb->literal_histograms_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(mb->literal_histograms)) return;

  BrotliClusterHistogramsLiteral(m, literal_histograms, literal_histograms_size,
      kMaxNumberOfHistograms, mb->literal_histograms,
      &mb->literal_histograms_size, mb->literal_context_map);
  if (BROTLI_IS_OOM(m)) return;
  BROTLI_FREE(m, literal_histograms);

  if (params->disable_literal_context_modeling) {
    /* Distribute assignment to all contexts. */
    for (i = mb->literal_split.num_types; i != 0;) {
      size_t j = 0;
      i--;
      for (; j < (1 << BROTLI_LITERAL_CONTEXT_BITS); j++) {
        mb->literal_context_map[(i << BROTLI_LITERAL_CONTEXT_BITS) + j] =
            mb->literal_context_map[i];
      }
    }
  }

  BROTLI_DCHECK(mb->distance_context_map == 0);
  mb->distance_context_map_size =
      mb->distance_split.num_types << BROTLI_DISTANCE_CONTEXT_BITS;
  mb->distance_context_map =
      BROTLI_ALLOC(m, uint32_t, mb->distance_context_map_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(mb->distance_context_map)) return;

  BROTLI_DCHECK(mb->distance_histograms == 0);
  mb->distance_histograms_size = mb->distance_context_map_size;
  mb->distance_histograms =
      BROTLI_ALLOC(m, HistogramDistance, mb->distance_histograms_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(mb->distance_histograms)) return;

  BrotliClusterHistogramsDistance(m, distance_histograms,
                                  mb->distance_context_map_size,
                                  kMaxNumberOfHistograms,
                                  mb->distance_histograms,
                                  &mb->distance_histograms_size,
                                  mb->distance_context_map);
  if (BROTLI_IS_OOM(m)) return;
  BROTLI_FREE(m, distance_histograms);
}